

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigUtil.c
# Opt level: O0

void Aig_ManCounterExampleValueTest(Aig_Man_t *pAig,Abc_Cex_t *pCex)

{
  int iVar1;
  uint iFrame_00;
  uint uVar2;
  uint uVar3;
  Aig_Obj_t *pObj_00;
  int iFrame;
  Aig_Obj_t *pObj;
  Abc_Cex_t *pCex_local;
  Aig_Man_t *pAig_local;
  
  iVar1 = Aig_ManObjNumMax(pAig);
  pObj_00 = Aig_ManObj(pAig,iVar1 / 2);
  iFrame_00 = Abc_MaxInt(0,pCex->iFrame + -1);
  printf("\nUsing counter-example, which asserts output %d in frame %d.\n",(ulong)(uint)pCex->iPo,
         (ulong)(uint)pCex->iFrame);
  Aig_ManCounterExampleValueStart(pAig,pCex);
  uVar2 = Aig_ObjId(pObj_00);
  iVar1 = Aig_ObjId(pObj_00);
  uVar3 = Aig_ManCounterExampleValueLookup(pAig,iVar1,iFrame_00);
  printf("Value of object %d in frame %d is %d.\n",(ulong)uVar2,(ulong)iFrame_00,(ulong)uVar3);
  Aig_ManCounterExampleValueStop(pAig);
  return;
}

Assistant:

void Aig_ManCounterExampleValueTest( Aig_Man_t * pAig, Abc_Cex_t * pCex )
{
    Aig_Obj_t * pObj = Aig_ManObj( pAig, Aig_ManObjNumMax(pAig)/2 );
    int iFrame = Abc_MaxInt( 0, pCex->iFrame - 1 );
    printf( "\nUsing counter-example, which asserts output %d in frame %d.\n", pCex->iPo, pCex->iFrame );
    Aig_ManCounterExampleValueStart( pAig, pCex );
    printf( "Value of object %d in frame %d is %d.\n", Aig_ObjId(pObj), iFrame,
        Aig_ManCounterExampleValueLookup(pAig, Aig_ObjId(pObj), iFrame) );
    Aig_ManCounterExampleValueStop( pAig );
}